

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3PendingTermsAddOne(Fts3Table *p,int iCol,int iPos,Fts3Hash *pHash,char *zToken,int nToken)

{
  PendingList *p_00;
  int iVar1;
  Fts3HashElem *pFVar2;
  PendingList *pPVar3;
  int rc;
  PendingList *pList;
  int local_3c;
  PendingList *local_38;
  
  local_3c = 0;
  pFVar2 = sqlite3Fts3HashFindElem(pHash,zToken,nToken);
  if (pFVar2 == (Fts3HashElem *)0x0) {
    local_38 = (PendingList *)0x0;
  }
  else {
    local_38 = (PendingList *)pFVar2->data;
  }
  if (local_38 != (PendingList *)0x0) {
    p->nPendingData = (p->nPendingData - (local_38->nData + nToken)) + -0x28;
  }
  iVar1 = fts3PendingListAppend(&local_38,p->iPrevDocid,(long)iCol,(long)iPos,&local_3c);
  p_00 = local_38;
  if (iVar1 != 0) {
    pPVar3 = (PendingList *)sqlite3Fts3HashInsert(pHash,zToken,nToken,local_38);
    if (p_00 == pPVar3) {
      sqlite3_free(p_00);
      local_3c = 7;
    }
  }
  if (local_3c == 0) {
    p->nPendingData = p->nPendingData + nToken + local_38->nData + 0x28;
  }
  return local_3c;
}

Assistant:

static int fts3PendingTermsAddOne(
  Fts3Table *p,
  int iCol,
  int iPos,
  Fts3Hash *pHash,                /* Pending terms hash table to add entry to */
  const char *zToken,
  int nToken
){
  PendingList *pList;
  int rc = SQLITE_OK;

  pList = (PendingList *)fts3HashFind(pHash, zToken, nToken);
  if( pList ){
    p->nPendingData -= (pList->nData + nToken + sizeof(Fts3HashElem));
  }
  if( fts3PendingListAppend(&pList, p->iPrevDocid, iCol, iPos, &rc) ){
    if( pList==fts3HashInsert(pHash, zToken, nToken, pList) ){
      /* Malloc failed while inserting the new entry. This can only 
      ** happen if there was no previous entry for this token.
      */
      assert( 0==fts3HashFind(pHash, zToken, nToken) );
      sqlite3_free(pList);
      rc = SQLITE_NOMEM;
    }
  }
  if( rc==SQLITE_OK ){
    p->nPendingData += (pList->nData + nToken + sizeof(Fts3HashElem));
  }
  return rc;
}